

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void new_localvar(LexState *ls,TString *name,int n)

{
  int iVar1;
  int in_EDX;
  FuncState *in_RSI;
  long in_RDI;
  FuncState *fs;
  char *what;
  undefined4 in_stack_ffffffffffffffe8;
  
  what = *(char **)(in_RDI + 0x30);
  if (200 < (int)((uint)(byte)what[0x4a] + in_EDX + 1)) {
    errorlimit(in_RSI,in_EDX,what);
  }
  iVar1 = registerlocalvar((LexState *)in_RSI,(TString *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8))
  ;
  *(short *)(what + (long)(int)((uint)(byte)what[0x4a] + in_EDX) * 2 + 0xc4) = (short)iVar1;
  return;
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}